

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

ly_set * lys_node_xpath_atomize(lys_node *node,int options)

{
  int iVar1;
  lys_node *plVar2;
  lys_node *plVar3;
  bool bVar4;
  ushort local_92;
  uint16_t i;
  ly_set *ret_set;
  lyxp_set set;
  lys_node *local_40;
  lys_node *tmp;
  lys_node *parent;
  lys_node *elem;
  lys_node *next;
  int options_local;
  lys_node *node_local;
  
  tmp = node;
  if (node == (lys_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_node_xpath_atomize");
    node_local = (lys_node *)0x0;
  }
  else {
    while( true ) {
      bVar4 = false;
      if (tmp != (lys_node *)0x0) {
        bVar4 = (tmp->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_NOTIF)) == LYS_UNKNOWN;
      }
      if (!bVar4) break;
      tmp = lys_parent(tmp);
    }
    if (tmp == (lys_node *)0x0) {
      node_local = (lys_node *)0x0;
    }
    else {
      node_local = (lys_node *)ly_set_new();
      parent = node;
      if (node_local == (lys_node *)0x0) {
        node_local = (lys_node *)0x0;
      }
      else {
        while (parent != (lys_node *)0x0) {
          if (((options & 2U) == 0) || ((parent->flags & 0x600) != 0)) {
            iVar1 = lyxp_node_atomize(parent,(lyxp_set *)&ret_set,0);
            if (iVar1 != 0) {
              ly_set_free((ly_set *)node_local);
              free((void *)set._8_8_);
              return (ly_set *)0x0;
            }
            for (local_92 = 0; (uint)local_92 < (uint)set.val._8_4_; local_92 = local_92 + 1) {
              if (*(int *)(set._8_8_ + 8 + (ulong)local_92 * 0x10) == 2) {
                if ((options & 2U) != 0) {
                  for (local_40 = *(lys_node **)(set._8_8_ + (ulong)local_92 * 0x10);
                      local_40 != (lys_node *)0x0 && local_40 != tmp;
                      local_40 = lys_parent(local_40)) {
                  }
                  if (local_40 != (lys_node *)0x0) goto LAB_001938ea;
                }
                iVar1 = ly_set_add((ly_set *)node_local,
                                   *(void **)(set._8_8_ + (ulong)local_92 * 0x10),0);
                if (iVar1 == -1) {
                  ly_set_free((ly_set *)node_local);
                  free((void *)set._8_8_);
                  return (ly_set *)0x0;
                }
              }
LAB_001938ea:
            }
            free((void *)set._8_8_);
            if ((options & 1U) == 0) {
              return (ly_set *)node_local;
            }
          }
          if ((parent->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
            elem = parent->child;
          }
          else {
            elem = (lys_node *)0x0;
          }
          if (elem == (lys_node *)0x0) {
            if (parent == node) {
              return (ly_set *)node_local;
            }
            elem = parent->next;
          }
          while (elem == (lys_node *)0x0) {
            if (parent->parent->nodetype == LYS_AUGMENT) {
              parent = parent->parent->prev;
            }
            else {
              parent = parent->parent;
            }
            plVar2 = lys_parent(parent);
            plVar3 = lys_parent(node);
            if (plVar2 == plVar3) break;
            elem = parent->next;
          }
          parent = elem;
        }
      }
    }
  }
  return (ly_set *)node_local;
}

Assistant:

ly_set *
lys_node_xpath_atomize(const struct lys_node *node, int options)
{
    const struct lys_node *next, *elem, *parent, *tmp;
    struct lyxp_set set;
    struct ly_set *ret_set;
    uint16_t i;

    if (!node) {
        LOGARG;
        return NULL;
    }

    for (parent = node; parent && !(parent->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT)); parent = lys_parent(parent));
    if (!parent) {
        /* not in input, output, or notification */
        return NULL;
    }

    ret_set = ly_set_new();
    if (!ret_set) {
        return NULL;
    }

    LY_TREE_DFS_BEGIN(node, next, elem) {
        if ((options & LYXP_NO_LOCAL) && !(elem->flags & (LYS_XPCONF_DEP | LYS_XPSTATE_DEP))) {
            /* elem has no dependencies from other subtrees and local nodes get discarded */
            goto next_iter;
        }

        if (lyxp_node_atomize(elem, &set, 0)) {
            ly_set_free(ret_set);
            free(set.val.snodes);
            return NULL;
        }

        for (i = 0; i < set.used; ++i) {
            switch (set.val.snodes[i].type) {
            case LYXP_NODE_ELEM:
                if (options & LYXP_NO_LOCAL) {
                    for (tmp = set.val.snodes[i].snode; tmp && (tmp != parent); tmp = lys_parent(tmp));
                    if (tmp) {
                        /* in local subtree, discard */
                        break;
                    }
                }
                if (ly_set_add(ret_set, set.val.snodes[i].snode, 0) == -1) {
                    ly_set_free(ret_set);
                    free(set.val.snodes);
                    return NULL;
                }
                break;
            default:
                /* ignore roots, text and attr should not ever appear */
                break;
            }
        }

        free(set.val.snodes);
        if (!(options & LYXP_RECURSIVE)) {
            break;
        }
next_iter:
        LY_TREE_DFS_END(node, next, elem);
    }

    return ret_set;
}